

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

Float __thiscall pbrt::Image::BilerpChannel(Image *this,Point2f p,int c,WrapMode2D wrapMode)

{
  undefined8 unaff_RBX;
  long lVar1;
  Point2i p_00;
  Point2i p_01;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  initializer_list<float> v_00;
  Float local_68;
  Float local_64;
  Float local_60;
  Float local_5c;
  undefined1 local_58 [16];
  array<float,_4> v;
  
  auVar4._8_56_ = in_register_00001208;
  auVar4._0_8_ = p.super_Tuple2<pbrt::Point2,_float>;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar2._8_4_ = 0xbf000000;
  auVar2._0_8_ = 0xbf000000bf000000;
  auVar2._12_4_ = 0xbf000000;
  auVar2 = vfmadd213ps_avx512vl(auVar5,auVar4._0_16_,auVar2);
  auVar5 = vroundps_avx(auVar2,9);
  auVar3._0_4_ = (int)auVar5._0_4_;
  auVar3._4_4_ = (uint)auVar5._4_4_;
  auVar3._8_4_ = (int)auVar5._8_4_;
  auVar3._12_4_ = (int)auVar5._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar3);
  lVar1 = CONCAT44((int)((ulong)unaff_RBX >> 0x20),auVar3._0_4_);
  local_58 = vsubps_avx(auVar2,auVar5);
  local_68 = GetChannel(this,(Point2i)(((ulong)auVar3._4_4_ << 0x20) + lVar1),c,wrapMode);
  p_00.super_Tuple2<pbrt::Point2,_int>.y = auVar3._4_4_;
  p_00.super_Tuple2<pbrt::Point2,_int>.x = auVar3._0_4_ + 1;
  local_64 = GetChannel(this,p_00,c,wrapMode);
  local_60 = GetChannel(this,(Point2i)(((ulong)(auVar3._4_4_ + 1) << 0x20) + lVar1),c,wrapMode);
  p_01.super_Tuple2<pbrt::Point2,_int>.y = auVar3._4_4_ + 1;
  p_01.super_Tuple2<pbrt::Point2,_int>.x = auVar3._0_4_ + 1;
  local_5c = GetChannel(this,p_01,c,wrapMode);
  v_00._M_len = 4;
  v_00._M_array = &local_68;
  pstd::array<float,_4>::array(&v,v_00);
  auVar5 = vmovshdup_avx(local_58);
  fVar7 = local_58._0_4_;
  fVar6 = auVar5._0_4_;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (1.0 - fVar6) * v.values[1])),
                           ZEXT416((uint)((1.0 - fVar7) * (1.0 - fVar6))),ZEXT416((uint)v.values[0])
                          );
  auVar5 = vfmadd132ss_fma(ZEXT416((uint)((1.0 - fVar7) * fVar6)),auVar5,ZEXT416((uint)v.values[2]))
  ;
  auVar5 = vfmadd132ss_fma(ZEXT416((uint)(fVar7 * fVar6)),auVar5,ZEXT416((uint)v.values[3]));
  return auVar5._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float BilerpChannel(Point2f p, int c, WrapMode2D wrapMode = WrapMode::Clamp) const {
        // Compute discrete pixel coordinates and offsets for _p_
        Float x = p[0] * resolution.x - 0.5f, y = p[1] * resolution.y - 0.5f;
        int xi = std::floor(x), yi = std::floor(y);
        Float dx = x - xi, dy = y - yi;

        // Load pixel channel values and return bilinearly interpolated value
        pstd::array<Float, 4> v = {GetChannel({xi, yi}, c, wrapMode),
                                   GetChannel({xi + 1, yi}, c, wrapMode),
                                   GetChannel({xi, yi + 1}, c, wrapMode),
                                   GetChannel({xi + 1, yi + 1}, c, wrapMode)};
        return ((1 - dx) * (1 - dy) * v[0] + dx * (1 - dy) * v[1] + (1 - dx) * dy * v[2] +
                dx * dy * v[3]);
    }